

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_22460c::BNTest_BadModulus_Test::TestBody(BNTest_BadModulus_Test *this)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  char *pcVar4;
  pointer pbVar5;
  BIGNUM *pBVar6;
  BIGNUM *pBVar7;
  BIGNUM *pBVar8;
  BN_CTX *pBVar9;
  pointer pbVar10;
  char *pcVar11;
  BN_MONT_CTX *pBVar12;
  char *in_R9;
  string local_468;
  AssertHelper local_448;
  Message local_440;
  bool local_431;
  undefined1 local_430 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_400;
  Message local_3f8;
  bool local_3e9;
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_3b8;
  Message local_3b0;
  bool local_3a1;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_328;
  Message local_320;
  int local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2e0;
  Message local_2d8;
  bool local_2c9;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__8;
  UniquePtr<BN_MONT_CTX> mont;
  AssertHelper local_248;
  Message local_240;
  bool local_231;
  undefined1 local_230 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_200;
  Message local_1f8;
  bool local_1e9;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1b8;
  Message local_1b0;
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e0;
  Message local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  string local_78;
  AssertHelper local_58;
  Message local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIGNUM> zero;
  unique_ptr<bignum_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIGNUM> b;
  UniquePtr<BIGNUM> a;
  BNTest_BadModulus_Test *this_local;
  
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&b,(pointer)pBVar3);
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&local_20,(pointer)pBVar3);
  pBVar3 = BN_new();
  std::unique_ptr<bignum_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bignum_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar3);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_48,&b,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_48,(AssertionResult *)(anon_var_dwarf_ac099 + 0xc),
               "false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
               ,0x605,pcVar4);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_50);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,&local_20,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x857b9a,
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                 ,0x606,pcVar4);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      testing::AssertionResult::AssertionResult<std::unique_ptr<bignum_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_d0,
                 (unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,(AssertionResult *)0x81d092,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                   ,0x607,pcVar4);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_d8);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        BN_zero(pbVar5);
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        pBVar6 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
        pBVar7 = BN_value_one();
        pBVar8 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        iVar2 = BN_div(pBVar3,pBVar6,pBVar7,pBVar8,(BN_CTX *)pBVar9);
        local_111 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_110,&local_111,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
        if (!bVar1) {
          testing::Message::Message(&local_120);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_110,
                     (AssertionResult *)
                     "BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx())","true","false",
                     in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_128,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60b,pcVar4);
          testing::internal::AssertHelper::operator=(&local_128,&local_120);
          testing::internal::AssertHelper::~AssertHelper(&local_128);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_120);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
        ERR_clear_error();
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        pBVar6 = BN_value_one();
        pBVar7 = BN_value_one();
        pBVar8 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        iVar2 = BN_mod_mul(pBVar3,pBVar6,pBVar7,pBVar8,(BN_CTX *)pBVar9);
        local_159 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_158,&local_159,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
        if (!bVar1) {
          testing::Message::Message(&local_168);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_158,
                     (AssertionResult *)
                     "BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x60f,pcVar4);
          testing::internal::AssertHelper::operator=(&local_170,&local_168);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_168);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
        ERR_clear_error();
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        pBVar6 = BN_value_one();
        pBVar7 = BN_value_one();
        pBVar8 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        iVar2 = BN_mod_exp(pBVar3,pBVar6,pBVar7,pBVar8,(BN_CTX *)pBVar9);
        local_1a1 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
        if (!bVar1) {
          testing::Message::Message(&local_1b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__6.message_,(internal *)local_1a0,
                     (AssertionResult *)
                     "BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx())","true"
                     ,"false",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x613,pcVar4);
          testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
          testing::Message::~Message(&local_1b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
        ERR_clear_error();
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        pBVar3 = BN_value_one();
        pBVar6 = BN_value_one();
        pbVar10 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        pcVar4 = (char *)0x0;
        iVar2 = BN_mod_exp_mont(pbVar5,(BIGNUM *)pBVar3,(BIGNUM *)pBVar6,pbVar10,pBVar9,
                                (BN_MONT_CTX *)0x0);
        local_1e9 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1e8,&local_1e9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
        if (!bVar1) {
          testing::Message::Message(&local_1f8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__7.message_,(internal *)local_1e8,
                     (AssertionResult *)
                     "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), __null)"
                     ,"true","false",pcVar4);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_200,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x617,pcVar4);
          testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
          testing::internal::AssertHelper::~AssertHelper(&local_200);
          std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
          testing::Message::~Message(&local_1f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
        ERR_clear_error();
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
        pBVar6 = BN_value_one();
        pBVar7 = BN_value_one();
        pBVar8 = (BIGNUM *)
                 std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        pcVar4 = (char *)0x0;
        iVar2 = BN_mod_exp_mont_consttime
                          (pBVar3,pBVar6,pBVar7,pBVar8,(BN_CTX *)pBVar9,(BN_MONT_CTX *)0x0);
        local_231 = iVar2 == 0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_230,&local_231,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
        if (!bVar1) {
          testing::Message::Message(&local_240);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&mont,(internal *)local_230,
                     (AssertionResult *)
                     "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr)"
                     ,"true","false",pcVar4);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_248,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x61b,pcVar11);
          testing::internal::AssertHelper::operator=(&local_248,&local_240);
          testing::internal::AssertHelper::~AssertHelper(&local_248);
          std::__cxx11::string::~string((string *)&mont);
          testing::Message::~Message(&local_240);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
        ERR_clear_error();
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        pBVar12 = BN_MONT_CTX_new_for_modulus(pbVar5,pBVar9);
        std::unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter>::
        unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bn_mont_ctx_st,bssl::internal::Deleter> *)&gtest_ar__8.message_,
                   pBVar12);
        local_281 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__8.message_);
        local_281 = !local_281;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_280,&local_281,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
        if (!bVar1) {
          testing::Message::Message(&local_290);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__9.message_,(internal *)local_280,
                     (AssertionResult *)0x86ceb4,"true","false",pcVar4);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_298,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x620,pcVar11);
          testing::internal::AssertHelper::operator=(&local_298,&local_290);
          testing::internal::AssertHelper::~AssertHelper(&local_298);
          std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
          testing::Message::~Message(&local_290);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
        ERR_clear_error();
        pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
        pBVar9 = BNTest::ctx(&this->super_BNTest);
        pBVar12 = BN_MONT_CTX_new_consttime(pbVar5,pBVar9);
        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                  ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                   pBVar12);
        local_2c9 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__8.message_);
        local_2c9 = !local_2c9;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_2c8,&local_2c9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
        if (!bVar1) {
          testing::Message::Message(&local_2d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__10.message_,(internal *)local_2c8,
                     (AssertionResult *)0x86ceb4,"true","false",pcVar4);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_2e0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x624,pcVar11);
          testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper(&local_2e0);
          std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
          testing::Message::~Message(&local_2d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
        ERR_clear_error();
        pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
        local_314 = BN_set_word(pBVar3,0x10);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_310,&local_314,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
        if (!bVar1) {
          testing::Message::Message(&local_320);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__11.message_,(internal *)local_310,
                     (AssertionResult *)"BN_set_word(b.get(), 16)","false","true",pcVar4);
          pcVar11 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_328,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                     ,0x628,pcVar11);
          testing::internal::AssertHelper::operator=(&local_328,&local_320);
          testing::internal::AssertHelper::~AssertHelper(&local_328);
          std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
          testing::Message::~Message(&local_320);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          pBVar9 = BNTest::ctx(&this->super_BNTest);
          pBVar12 = BN_MONT_CTX_new_for_modulus(pbVar5,pBVar9);
          std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                    ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                     pBVar12);
          local_359 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__8.message_);
          local_359 = !local_359;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_358,&local_359,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
          if (!bVar1) {
            testing::Message::Message(&local_368);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__12.message_,(internal *)local_358,
                       (AssertionResult *)0x86ceb4,"true","false",pcVar4);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_370,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62b,pcVar11);
            testing::internal::AssertHelper::operator=(&local_370,&local_368);
            testing::internal::AssertHelper::~AssertHelper(&local_370);
            std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
            testing::Message::~Message(&local_368);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
          ERR_clear_error();
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          pBVar9 = BNTest::ctx(&this->super_BNTest);
          pBVar12 = BN_MONT_CTX_new_consttime(pbVar5,pBVar9);
          std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::reset
                    ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_,
                     pBVar12);
          local_3a1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&gtest_ar__8.message_);
          local_3a1 = !local_3a1;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_3a0,&local_3a1,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
          if (!bVar1) {
            testing::Message::Message(&local_3b0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__13.message_,(internal *)local_3a0,
                       (AssertionResult *)0x86ceb4,"true","false",pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_3b8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x62f,pcVar4);
            testing::internal::AssertHelper::operator=(&local_3b8,&local_3b0);
            testing::internal::AssertHelper::~AssertHelper(&local_3b8);
            std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
            testing::Message::~Message(&local_3b0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
          ERR_clear_error();
          pbVar5 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
          pBVar3 = BN_value_one();
          pBVar6 = BN_value_one();
          pbVar10 = std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          pBVar9 = BNTest::ctx(&this->super_BNTest);
          pcVar4 = (char *)0x0;
          iVar2 = BN_mod_exp_mont(pbVar5,(BIGNUM *)pBVar3,(BIGNUM *)pBVar6,pbVar10,pBVar9,
                                  (BN_MONT_CTX *)0x0);
          local_3e9 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_3e8,&local_3e9,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
          if (!bVar1) {
            testing::Message::Message(&local_3f8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__14.message_,(internal *)local_3e8,
                       (AssertionResult *)
                       "BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), __null)"
                       ,"true","false",pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_400,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x633,pcVar4);
            testing::internal::AssertHelper::operator=(&local_400,&local_3f8);
            testing::internal::AssertHelper::~AssertHelper(&local_400);
            std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
            testing::Message::~Message(&local_3f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
          ERR_clear_error();
          pBVar3 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&b);
          pBVar6 = BN_value_one();
          pBVar7 = BN_value_one();
          pBVar8 = (BIGNUM *)std::unique_ptr<bignum_st,_bssl::internal::Deleter>::get(&local_20);
          pBVar9 = BNTest::ctx(&this->super_BNTest);
          pcVar4 = (char *)0x0;
          iVar2 = BN_mod_exp_mont_consttime
                            (pBVar3,pBVar6,pBVar7,pBVar8,(BN_CTX *)pBVar9,(BN_MONT_CTX *)0x0);
          local_431 = iVar2 == 0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_430,&local_431,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
          if (!bVar1) {
            testing::Message::Message(&local_440);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_468,(internal *)local_430,
                       (AssertionResult *)
                       "BN_mod_exp_mont_consttime( a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr)"
                       ,"true","false",pcVar4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_448,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/bn/bn_test.cc"
                       ,0x637,pcVar4);
            testing::internal::AssertHelper::operator=(&local_448,&local_440);
            testing::internal::AssertHelper::~AssertHelper(&local_448);
            std::__cxx11::string::~string((string *)&local_468);
            testing::Message::~Message(&local_440);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
          ERR_clear_error();
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
        std::unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bn_mont_ctx_st,_bssl::internal::Deleter> *)&gtest_ar__8.message_);
      }
    }
  }
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr(&b);
  return;
}

Assistant:

TEST_F(BNTest, BadModulus) {
  bssl::UniquePtr<BIGNUM> a(BN_new());
  bssl::UniquePtr<BIGNUM> b(BN_new());
  bssl::UniquePtr<BIGNUM> zero(BN_new());
  ASSERT_TRUE(a);
  ASSERT_TRUE(b);
  ASSERT_TRUE(zero);

  BN_zero(zero.get());

  EXPECT_FALSE(BN_div(a.get(), b.get(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_mul(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(
      BN_mod_exp(a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx()));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(),
                               zero.get(), ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), zero.get(), ctx(), nullptr));
  ERR_clear_error();

  bssl::UniquePtr<BN_MONT_CTX> mont(
      BN_MONT_CTX_new_for_modulus(zero.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  // Some operations also may not be used with an even modulus.
  ASSERT_TRUE(BN_set_word(b.get(), 16));

  mont.reset(BN_MONT_CTX_new_for_modulus(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  mont.reset(BN_MONT_CTX_new_consttime(b.get(), ctx()));
  EXPECT_FALSE(mont);
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont(a.get(), BN_value_one(), BN_value_one(), b.get(),
                               ctx(), NULL));
  ERR_clear_error();

  EXPECT_FALSE(BN_mod_exp_mont_consttime(
      a.get(), BN_value_one(), BN_value_one(), b.get(), ctx(), nullptr));
  ERR_clear_error();
}